

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

unsigned_long_long __thiscall QPDFObjectHandle::getUIntValue(QPDFObjectHandle *this)

{
  unsigned_long_long uVar1;
  string local_38;
  
  uVar1 = getIntValue(this);
  if ((long)uVar1 < 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"unsigned value request for negative number; returning 0","");
    warnIfPossible(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

unsigned long long
QPDFObjectHandle::getUIntValue() const
{
    long long v = getIntValue();
    if (v < 0) {
        QTC::TC("qpdf", "QPDFObjectHandle uint returning 0");
        warnIfPossible("unsigned value request for negative number; returning 0");
        return 0;
    } else {
        return static_cast<unsigned long long>(v);
    }
}